

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

int calculateCommandLineLengthLimit(int linkRuleLength)

{
  int iVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  int *piVar5;
  int sz;
  size_t arrSz;
  int linkRuleLength_local;
  
  if (calculateCommandLineLengthLimit(int)::limits == '\0') {
    iVar1 = __cxa_guard_acquire();
    if (iVar1 != 0) {
      lVar3 = sysconf(0);
      calculateCommandLineLengthLimit::limits[0] = (int)lVar3 + -1000;
      lVar3 = sysconf(0x1e);
      calculateCommandLineLengthLimit::limits[1] = (int)lVar3 * 0x20 + -1000;
      calculateCommandLineLengthLimit::limits[2] = std::numeric_limits<int>::max();
      __cxa_guard_release(&calculateCommandLineLengthLimit(int)::limits);
    }
  }
  sVar4 = cmArraySize<int,3ul>(&calculateCommandLineLengthLimit::limits);
  piVar5 = std::min_element<int_const*>
                     (calculateCommandLineLengthLimit::limits,
                      calculateCommandLineLengthLimit::limits + sVar4);
  iVar1 = *piVar5;
  iVar2 = std::numeric_limits<int>::max();
  if (iVar1 == iVar2) {
    arrSz._4_4_ = -1;
  }
  else {
    arrSz._4_4_ = iVar1 - linkRuleLength;
  }
  return arrSz._4_4_;
}

Assistant:

static int calculateCommandLineLengthLimit(int linkRuleLength)
{
  static int const limits[] = {
#ifdef _WIN32
    8000,
#endif
#if defined(__APPLE__) || defined(__HAIKU__) || defined(__linux)
    // for instance ARG_MAX is 2096152 on Ubuntu or 262144 on Mac
    ((int)sysconf(_SC_ARG_MAX)) - 1000,
#endif
#if defined(__linux)
    // #define MAX_ARG_STRLEN (PAGE_SIZE * 32) in Linux's binfmts.h
    ((int)sysconf(_SC_PAGESIZE) * 32) - 1000,
#endif
    std::numeric_limits<int>::max()
  };

  size_t const arrSz = cmArraySize(limits);
  int const sz = *std::min_element(limits, limits + arrSz);
  if (sz == std::numeric_limits<int>::max())
    {
    return -1;
    }

  return sz - linkRuleLength;
}